

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

void LiteScript::StateExecutor::I_VALUE_NUMBER(State *state,Instruction *instr)

{
  Object *pOVar1;
  Number number;
  Number local_30;
  
  state->line_num = state->line_num + 1;
  Number::Number(&local_30);
  if (instr->comp_type == '\x03') {
    Number::Number((Number *)&stack0xffffffffffffffd8,(instr->comp_value).v_float);
  }
  else {
    if (instr->comp_type != '\x02') {
      return;
    }
    Number::Number((Number *)&stack0xffffffffffffffd8,(instr->comp_value).v_integer);
  }
  Number::operator=(&local_30,(Number *)&stack0xffffffffffffffd8);
  Memory::Create((Memory *)&stack0xffffffffffffffd8,(Type *)state->memory);
  std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
  emplace_back<LiteScript::Variable>(&state->op_lifo,(Variable *)&stack0xffffffffffffffd8);
  Variable::~Variable((Variable *)&stack0xffffffffffffffd8);
  pOVar1 = Variable::operator->
                     ((state->op_lifo).
                      super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1);
  Number::operator=((Number *)pOVar1->data,&local_30);
  return;
}

Assistant:

void LiteScript::StateExecutor::I_VALUE_NUMBER(State& state, Instruction& instr) {
    state.line_num++;
    Number number;
    if (instr.comp_type == Instruction::CompType::COMP_TYPE_INTEGER)
        number = Number(instr.comp_value.v_integer);
    else if (instr.comp_type == Instruction::CompType::COMP_TYPE_FLOAT)
        number = Number(instr.comp_value.v_float);
    else
        return;
    state.op_lifo.push_back(state.memory.Create(Type::NUMBER));
    state.op_lifo.back()->GetData<Number>() = number;
}